

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

void __thiscall slang::ast::DriverVisitor::handle(DriverVisitor *this,ValueExpressionBase *expr)

{
  DriverBitRange bounds_00;
  ValueSymbol **__x;
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  long lVar4;
  ValueSymbol **__y;
  Symbol *pSVar5;
  ValueDriver **__y_00;
  long in_RSI;
  long in_RDI;
  pair<unsigned_long,_unsigned_long> pVar6;
  type *driver;
  type *bounds;
  iterator __end2;
  iterator __begin2;
  SmallVector<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>,_2UL>
  *__range2;
  const_iterator it;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  range;
  SmallVector<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>,_2UL>
  drivers;
  Scope *scope;
  ValueSymbol *sym;
  locator loc;
  size_t pos0;
  size_t hash;
  ValueSymbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  Compilation *in_stack_fffffffffffffc08;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  *in_stack_fffffffffffffc10;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_fffffffffffffc18;
  const_iterator *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
  *in_stack_fffffffffffffc30;
  unsigned_long in_stack_fffffffffffffc38;
  Symbol *in_stack_fffffffffffffc40;
  ValueDriver **in_stack_fffffffffffffc48;
  undefined6 in_stack_fffffffffffffc50;
  Scope *in_stack_fffffffffffffc58;
  unsigned_long in_stack_fffffffffffffc60;
  Scope *local_398;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  size_t in_stack_fffffffffffffc78;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
  *in_stack_fffffffffffffc80;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *local_338;
  pointer pEStack_330;
  ValueDriver *local_328;
  iterator local_318;
  iterator local_310;
  ValueSymbol *in_stack_fffffffffffffcf8;
  SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
  *this_00;
  pair<unsigned_long,_unsigned_long> local_300;
  pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*> local_2f0 [12];
  SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
  local_1c8;
  Scope *local_180;
  bitmask<slang::ast::CompilationFlags> local_174;
  Symbol *local_170;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_168;
  Symbol *local_150;
  Symbol **local_138;
  long local_130;
  Symbol **local_128;
  long local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::ValueSymbol_*>
  local_a0;
  size_t local_88;
  size_t local_80;
  ValueSymbol **local_78;
  Symbol **local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  ValueSymbol **local_10;
  long local_8;
  
  local_170 = *(Symbol **)(in_RSI + 0x30);
  lVar4 = in_RDI + 0x68;
  local_138 = &local_170;
  local_150 = local_170;
  local_130 = lVar4;
  local_128 = local_138;
  local_120 = lVar4;
  local_70 = local_138;
  local_68 = lVar4;
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
             ::key_from<slang::ast::ValueSymbol_const*>((ValueSymbol **)0x9ec0e8);
  local_80 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
             ::hash_for<slang::ast::ValueSymbol_const*>
                       ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                         *)in_stack_fffffffffffffc10,(ValueSymbol **)in_stack_fffffffffffffc08);
  local_88 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
             ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                             *)in_stack_fffffffffffffc10,(size_t)in_stack_fffffffffffffc08);
  local_10 = local_78;
  local_20 = local_80;
  local_18 = local_88;
  local_8 = lVar4;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_88);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<const_slang::ast::ValueSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
               ::groups((table_arrays<const_slang::ast::ValueSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                         *)0x9ec1b5);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<const_slang::ast::ValueSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                 ::elements((table_arrays<const_slang::ast::ValueSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                             *)0x9ec207);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffc80 =
             (table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
              *)boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                        *)0x9ec25a);
        __x = local_10;
        __y = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
              ::key_from<slang::ast::ValueSymbol_const*>((ValueSymbol **)0x9ec28a);
        bVar1 = std::equal_to<const_slang::ast::ValueSymbol_*>::operator()
                          ((equal_to<const_slang::ast::ValueSymbol_*> *)in_stack_fffffffffffffc80,
                           __x,__y);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::ValueSymbol_*>
          ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
          goto LAB_009ec384;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffc10,(size_t)in_stack_fffffffffffffc08);
    if (bVar1) break;
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,*(size_t *)(in_RDI + 0x78));
    if (!bVar1) {
      memset(&local_a0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::ValueSymbol_*>
      ::table_locator(&local_a0);
LAB_009ec384:
      bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_a0);
      if (bVar1) {
        local_b0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                   ::make_iterator((locator *)0x9ec3a4);
        local_b1 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_168,&local_b0,&local_b1);
      }
      else if (*(ulong *)(in_RDI + 0x98) < *(ulong *)(in_RDI + 0x90)) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
        ::unchecked_emplace_at<slang::ast::ValueSymbol_const*>
                  (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                   (size_t)in_stack_fffffffffffffc20,(ValueSymbol **)in_stack_fffffffffffffc18);
        local_c8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                   ::make_iterator((locator *)0x9ec42a);
        local_e1[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_168,&local_c8,local_e1);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
        ::unchecked_emplace_with_rehash<slang::ast::ValueSymbol_const*>
                  (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   (ValueSymbol **)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
        local_f8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                   ::make_iterator((locator *)0x9ec493);
        local_111[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_168,&local_f8,local_111);
      }
      if (((local_168.second ^ 0xffU) & 1) == 0) {
        Scope::getCompilation((Scope *)(*(long *)(in_RDI + 8) + 0x40));
        bitmask<slang::ast::CompilationFlags>::bitmask(&local_174,AllowMultiDrivenLocals);
        bVar1 = Compilation::hasFlag
                          (in_stack_fffffffffffffc08,
                           (bitmask<slang::ast::CompilationFlags>)
                           (underlying_type)((ulong)in_stack_fffffffffffffc10 >> 0x20));
        if (bVar1) {
          local_180 = Symbol::getParentScope(local_150);
          while( true ) {
            bVar1 = false;
            if (local_180 != (Scope *)0x0) {
              pSVar5 = Scope::asSymbol(local_180);
              bVar1 = pSVar5->kind == StatementBlock;
            }
            if (!bVar1) break;
            pSVar5 = Scope::asSymbol(local_180);
            local_180 = Symbol::getParentScope(pSVar5);
          }
          in_stack_fffffffffffffc60 = *(unsigned_long *)(in_RDI + 8);
          local_398 = (Scope *)0x0;
          if (in_stack_fffffffffffffc60 != 0) {
            local_398 = (Scope *)(in_stack_fffffffffffffc60 + 0x40);
          }
          if (local_180 == local_398) {
            return;
          }
          in_stack_fffffffffffffc77 = 0;
          in_stack_fffffffffffffc58 = local_180;
        }
        SmallVector<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>,_2UL>
        ::SmallVector((SmallVector<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>,_2UL>
                       *)0x9ec5e4);
        ValueSymbol::drivers(in_stack_fffffffffffffcf8);
        std::ranges::
        subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
        ::begin((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                 *)in_stack_fffffffffffffc08);
        pVar6.second = (unsigned_long)in_stack_fffffffffffffc30;
        pVar6.first = in_stack_fffffffffffffc38;
        while( true ) {
          std::ranges::
          subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
          ::end((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                 *)in_stack_fffffffffffffc08);
          uVar2 = IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::
                  operator==(&in_stack_fffffffffffffc10->_M_begin,
                             (const_iterator *)in_stack_fffffffffffffc08);
          bVar3 = uVar2 ^ 0xff;
          IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::
          ~const_iterator((const_iterator *)0x9ec65d);
          if ((bVar3 & 1) == 0) break;
          in_stack_fffffffffffffc48 =
               IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::
               operator*(in_stack_fffffffffffffc20);
          in_stack_fffffffffffffc40 =
               not_null::operator_cast_to_Symbol_((not_null<const_slang::ast::Symbol_*> *)0x9ec711);
          if (in_stack_fffffffffffffc40 == *(Symbol **)(in_RDI + 8)) {
            pVar6 = IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator
                    ::bounds((const_iterator *)pVar6.second);
            local_300 = pVar6;
            __y_00 = IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator
                     ::operator*(in_stack_fffffffffffffc20);
            std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>::
            pair<std::pair<unsigned_long,_unsigned_long>,_true>(local_2f0,&local_300,__y_00);
            SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
            ::push_back((SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
                         *)in_stack_fffffffffffffc10,
                        (pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>
                         *)in_stack_fffffffffffffc08);
          }
          IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::
          operator++(&in_stack_fffffffffffffc10->_M_begin);
        }
        IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::
        ~const_iterator((const_iterator *)0x9ec676);
        this_00 = &local_1c8;
        local_310 = SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
                    ::begin(this_00);
        local_318 = SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
                    ::end(this_00);
        for (; local_310 != local_318; local_310 = local_310 + 1) {
          local_328 = local_310->second;
          local_338 = (IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *)
                      (local_310->first).first;
          pEStack_330 = (pointer)(local_310->first).second;
          in_stack_fffffffffffffc10 =
               (subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                *)&local_338;
          std::get<0ul,std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>
                    ((pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>
                      *)0x9ec850);
          std::get<1ul,std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>
                    ((pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>
                      *)0x9ec862);
          not_null<const_slang::ast::Expression_*>::operator*
                    ((not_null<const_slang::ast::Expression_*> *)0x9ec89a);
          bounds_00.second = in_stack_fffffffffffffc60;
          bounds_00.first = (unsigned_long)in_stack_fffffffffffffc58;
          ValueSymbol::addDriver
                    ((ValueSymbol *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffc50)),
                     (DriverKind)((ulong)in_stack_fffffffffffffc48 >> 0x38),bounds_00,
                     (Expression *)in_stack_fffffffffffffc40,(Symbol *)pVar6.first,
                     (Expression *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
        }
        std::ranges::
        subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
        ::~subrange(in_stack_fffffffffffffc10);
        SmallVector<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>,_2UL>
        ::~SmallVector((SmallVector<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>,_2UL>
                        *)0x9ec90e);
      }
      return;
    }
  }
  memset(&local_a0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::ValueSymbol_*>
  ::table_locator(&local_a0);
  goto LAB_009ec384;
}

Assistant:

void handle(const ValueExpressionBase& expr) {
        auto& sym = expr.symbol;
        if (!visitedValues.emplace(&sym).second)
            return;

        if (sub.getCompilation().hasFlag(CompilationFlags::AllowMultiDrivenLocals)) {
            auto scope = sym.getParentScope();
            while (scope && scope->asSymbol().kind == SymbolKind::StatementBlock)
                scope = scope->asSymbol().getParentScope();

            if (scope == &sub) {
                // This is a local variable of the subroutine,
                // so don't do driver checking.
                return;
            }
        }

        // If the target symbol is driven by the subroutine we're inspecting,
        // add another driver for the procedure we're originally called from.
        SmallVector<std::pair<DriverBitRange, const ValueDriver*>> drivers;
        auto range = sym.drivers();
        for (auto it = range.begin(); it != range.end(); ++it) {
            if ((*it)->containingSymbol == &sub)
                drivers.push_back({it.bounds(), *it});
        }

        // This needs to be a separate loop to avoid mutating the driver map
        // while iterating over it.
        for (auto [bounds, driver] : drivers) {
            sym.addDriver(DriverKind::Procedural, bounds, *driver->prefixExpression, procedure,
                          callExpr);
        }
    }